

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::interval_t,duckdb::interval_t,duckdb::GreaterThanEquals,false,false,true,true>
                (interval_t *ldata,interval_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  sel_t *psVar4;
  long lVar5;
  bool bVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  idx_t iVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  sel_t sVar19;
  long lVar20;
  
  if (count + 0x3f < 0x40) {
    iVar14 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    iVar14 = 0;
    lVar20 = 0;
    uVar10 = 0;
    uVar18 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar16 = 0xffffffffffffffff;
      }
      else {
        uVar16 = puVar1[uVar10];
      }
      uVar11 = uVar18 + 0x40;
      if (count <= uVar18 + 0x40) {
        uVar11 = count;
      }
      uVar13 = uVar18;
      if (uVar16 == 0xffffffffffffffff) {
        if (uVar18 < uVar11) {
          psVar2 = sel->sel_vector;
          psVar3 = true_sel->sel_vector;
          psVar4 = false_sel->sel_vector;
          uVar16 = uVar18 << 4 | 8;
          do {
            uVar13 = uVar18;
            if (psVar2 != (sel_t *)0x0) {
              uVar13 = (ulong)psVar2[uVar18];
            }
            lVar5 = *(long *)((long)&rdata->months + uVar16);
            lVar8 = (long)*(int *)((long)rdata + (uVar16 - 4)) + lVar5 / 86400000000;
            lVar15 = lVar8 % 0x1e;
            lVar7 = (long)*(int *)((long)rdata + (uVar16 - 8)) + lVar8 / 0x1e;
            lVar8 = *(long *)((long)&ldata->months + uVar16);
            lVar9 = (long)*(int *)((long)ldata + (uVar16 - 4)) + lVar8 / 86400000000;
            lVar12 = lVar9 % 0x1e;
            lVar9 = (long)*(int *)((long)ldata + (uVar16 - 8)) + lVar9 / 0x1e;
            if (lVar9 < lVar7) {
              bVar6 = false;
            }
            else {
              bVar6 = true;
              if (lVar9 <= lVar7) {
                if (lVar12 < lVar15) {
                  bVar6 = false;
                }
                else {
                  bVar6 = lVar5 % 86400000000 <= lVar8 % 86400000000 || lVar15 < lVar12;
                }
              }
            }
            psVar3[iVar14] = (sel_t)uVar13;
            iVar14 = iVar14 + bVar6;
            psVar4[lVar20] = (sel_t)uVar13;
            lVar20 = lVar20 + (ulong)(bVar6 ^ 1);
            uVar18 = uVar18 + 1;
            uVar16 = uVar16 + 0x10;
            uVar13 = uVar18;
          } while (uVar11 != uVar18);
        }
      }
      else if (uVar16 == 0) {
        uVar13 = uVar11;
        if (uVar18 < uVar11) {
          psVar2 = sel->sel_vector;
          psVar3 = false_sel->sel_vector;
          do {
            sVar19 = (sel_t)uVar18;
            if (psVar2 != (sel_t *)0x0) {
              sVar19 = psVar2[uVar18];
            }
            psVar3[lVar20] = sVar19;
            lVar20 = lVar20 + 1;
            uVar18 = uVar18 + 1;
          } while (uVar11 != uVar18);
        }
      }
      else if (uVar18 < uVar11) {
        psVar2 = sel->sel_vector;
        psVar3 = true_sel->sel_vector;
        psVar4 = false_sel->sel_vector;
        uVar13 = uVar18 << 4 | 8;
        uVar17 = 0;
        do {
          if (psVar2 == (sel_t *)0x0) {
            sVar19 = (int)uVar17 + (int)uVar18;
          }
          else {
            sVar19 = psVar2[uVar18 + uVar17];
          }
          if ((uVar16 >> (uVar17 & 0x3f) & 1) == 0) {
LAB_014c58bf:
            bVar6 = false;
          }
          else {
            lVar5 = *(long *)((long)&rdata->months + uVar13);
            lVar8 = (long)*(int *)((long)rdata + (uVar13 - 4)) + lVar5 / 86400000000;
            lVar7 = lVar8 % 0x1e;
            lVar15 = (long)*(int *)((long)rdata + (uVar13 - 8)) + lVar8 / 0x1e;
            lVar8 = *(long *)((long)&ldata->months + uVar13);
            lVar9 = (long)*(int *)((long)ldata + (uVar13 - 4)) + lVar8 / 86400000000;
            lVar12 = lVar9 % 0x1e;
            lVar9 = (long)*(int *)((long)ldata + (uVar13 - 8)) + lVar9 / 0x1e;
            if (lVar9 < lVar15) {
              bVar6 = false;
            }
            else {
              bVar6 = true;
              if (lVar9 <= lVar15) {
                if (lVar12 < lVar7) goto LAB_014c58bf;
                bVar6 = lVar5 % 86400000000 <= lVar8 % 86400000000 || lVar7 < lVar12;
              }
            }
          }
          psVar3[iVar14] = sVar19;
          iVar14 = iVar14 + bVar6;
          psVar4[lVar20] = sVar19;
          lVar20 = (ulong)(bVar6 ^ 1) + lVar20;
          uVar17 = uVar17 + 1;
          uVar13 = uVar13 + 0x10;
        } while ((uVar18 - uVar11) + uVar17 != 0);
        uVar13 = uVar18 + uVar17;
      }
      uVar10 = uVar10 + 1;
      uVar18 = uVar13;
    } while (uVar10 != count + 0x3f >> 6);
  }
  return iVar14;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}